

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsSecondDeriv
          (BeagleCPUImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int secondDerivativeIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood,
          double *outSumFirstDerivative,double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  float *pfVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  int *piVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  double *pdVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  int j;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  float *pfVar27;
  float *pfVar28;
  int k;
  ulong uVar29;
  long lVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_ZMM1 [64];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 in_XMM4_Qb;
  undefined1 auVar48 [16];
  undefined8 in_XMM6_Qb;
  
  pfVar9 = this->gPartials[parIndex];
  ppfVar10 = this->gTransitionMatrices;
  pfVar11 = ppfVar10[probIndex];
  pfVar12 = ppfVar10[firstDerivativeIndex];
  pfVar13 = ppfVar10[secondDerivativeIndex];
  pfVar14 = this->gStateFrequencies[stateFrequenciesIndex];
  pfVar15 = this->gCategoryWeights[categoryWeightsIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->secondDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  if ((childIndex < this->kTipCount) &&
     (piVar16 = this->gTipStates[childIndex], piVar16 != (int *)0x0)) {
    uVar4 = this->kPatternCount;
    uVar5 = this->kCategoryCount;
    lVar25 = 0;
    for (uVar24 = 0; uVar24 != (~((int)uVar5 >> 0x1f) & uVar5); uVar24 = uVar24 + 1) {
      iVar6 = this->kPartialsPaddedStateCount;
      uVar7 = this->kStateCount;
      lVar25 = (long)(int)lVar25;
      lVar30 = 0;
      pfVar27 = pfVar9 + lVar25;
      fVar37 = pfVar15[uVar24];
      iVar8 = this->kMatrixSize;
      for (uVar29 = 0; uVar29 != (~((int)uVar4 >> 0x1f) & uVar4); uVar29 = uVar29 + 1) {
        lVar30 = (long)(int)lVar30;
        pfVar28 = this->integrationTmp;
        pfVar17 = this->firstDerivTmp;
        iVar23 = this->kTransPaddedStateCount;
        pfVar18 = this->secondDerivTmp;
        lVar22 = (long)piVar16[uVar29] + (long)(iVar8 * (int)uVar24);
        for (uVar26 = 0; (~((int)uVar7 >> 0x1f) & uVar7) != uVar26; uVar26 = uVar26 + 1) {
          auVar32 = vfmadd213ss_fma(ZEXT416((uint)(pfVar11[lVar22] * pfVar27[uVar26])),
                                    ZEXT416((uint)fVar37),ZEXT416((uint)pfVar28[lVar30 + uVar26]));
          pfVar28[lVar30 + uVar26] = auVar32._0_4_;
          auVar32 = vfmadd213ss_fma(ZEXT416((uint)(pfVar12[lVar22] * pfVar27[uVar26])),
                                    ZEXT416((uint)fVar37),ZEXT416((uint)pfVar17[lVar30 + uVar26]));
          pfVar17[lVar30 + uVar26] = auVar32._0_4_;
          pfVar19 = pfVar13 + lVar22;
          lVar22 = lVar22 + iVar23;
          auVar32 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar19 * pfVar27[uVar26])),
                                    ZEXT416((uint)fVar37),ZEXT416((uint)pfVar18[lVar30 + uVar26]));
          pfVar18[lVar30 + uVar26] = auVar32._0_4_;
        }
        pfVar27 = pfVar27 + iVar6;
        lVar25 = lVar25 + iVar6;
        lVar30 = lVar30 + uVar26;
      }
    }
  }
  else {
    lVar25 = 0;
    pfVar27 = this->gPartials[childIndex];
    uVar4 = this->kCategoryCount;
    uVar5 = this->kPatternCount;
    for (uVar24 = 0; uVar24 != (~((int)uVar4 >> 0x1f) & uVar4); uVar24 = uVar24 + 1) {
      iVar6 = this->kPartialsPaddedStateCount;
      lVar25 = (long)(int)lVar25;
      auVar32._0_8_ = (double)pfVar15[uVar24];
      auVar32._8_8_ = in_ZMM1._8_8_;
      uVar7 = this->kStateCount;
      lVar30 = 0;
      pfVar28 = pfVar27 + lVar25;
      iVar8 = this->kMatrixSize;
      for (uVar21 = 0; uVar21 != (~((int)uVar5 >> 0x1f) & uVar5); uVar21 = uVar21 + 1) {
        pfVar17 = this->integrationTmp;
        pfVar18 = this->firstDerivTmp;
        pfVar19 = this->secondDerivTmp;
        lVar30 = (long)(int)lVar30;
        uVar29 = 0;
        iVar23 = iVar8 * (int)uVar24;
        while (uVar29 != (~((int)uVar7 >> 0x1f) & uVar7)) {
          dVar31 = 0.0;
          dVar43 = 0.0;
          dVar38 = 0.0;
          for (uVar26 = 0; uVar7 != uVar26; uVar26 = uVar26 + 1) {
            fVar37 = pfVar28[uVar26];
            dVar31 = dVar31 + (double)(fVar37 * pfVar11[(long)iVar23 + uVar26]);
            dVar43 = dVar43 + (double)(fVar37 * pfVar12[(long)iVar23 + uVar26]);
            dVar38 = dVar38 + (double)(fVar37 * pfVar13[(long)iVar23 + uVar26]);
          }
          auVar48._0_8_ = (double)pfVar17[lVar30];
          auVar48._8_8_ = in_XMM6_Qb;
          iVar23 = iVar23 + uVar7 + 1;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = dVar31 * (double)pfVar9[lVar25 + uVar29];
          auVar39 = vfmadd231sd_fma(auVar48,auVar32,auVar45);
          pfVar17[lVar30] = (float)auVar39._0_8_;
          auVar46._0_8_ = (double)pfVar18[lVar30];
          auVar46._8_8_ = in_XMM6_Qb;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = dVar43 * (double)pfVar9[lVar25 + uVar29];
          auVar39 = vfmadd231sd_fma(auVar46,auVar32,auVar44);
          pfVar18[lVar30] = (float)auVar39._0_8_;
          lVar22 = lVar25 + uVar29;
          auVar47._0_8_ = (double)pfVar19[lVar30];
          auVar47._8_8_ = in_XMM6_Qb;
          uVar29 = uVar29 + 1;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = dVar38 * (double)pfVar9[lVar22];
          auVar39 = vfmadd231sd_fma(auVar47,auVar32,auVar39);
          in_ZMM1 = ZEXT1664(CONCAT124(auVar39._4_12_,(float)auVar39._0_8_));
          pfVar19[lVar30] = (float)auVar39._0_8_;
          lVar30 = lVar30 + 1;
          in_XMM4_Qb = in_XMM6_Qb;
        }
        pfVar28 = pfVar28 + iVar6;
        lVar25 = lVar25 + iVar6;
      }
    }
  }
  lVar25 = 0;
  for (lVar30 = 0; uVar4 = this->kPatternCount, lVar30 < (int)uVar4; lVar30 = lVar30 + 1) {
    lVar25 = (long)(int)lVar25;
    auVar32 = ZEXT816(0) << 0x40;
    auVar39 = ZEXT816(0) << 0x40;
    auVar44 = ZEXT816(0) << 0x40;
    uVar24 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
    for (uVar29 = 0; uVar24 != uVar29; uVar29 = uVar29 + 1) {
      fVar37 = pfVar14[uVar29];
      auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar37),
                                ZEXT416((uint)this->integrationTmp[lVar25 + uVar29]));
      auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar37),
                                ZEXT416((uint)this->firstDerivTmp[lVar25 + uVar29]));
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar37),
                                ZEXT416((uint)this->secondDerivTmp[lVar25 + uVar29]));
    }
    fVar37 = auVar32._0_4_;
    lVar25 = lVar25 + uVar24;
    dVar31 = log((double)fVar37);
    this->outLogLikelihoodsTmp[lVar30] = (float)dVar31;
    auVar33._0_4_ = auVar39._0_4_ / fVar37;
    auVar33._4_12_ = SUB6012((undefined1  [60])0x0,0);
    this->outFirstDerivativesTmp[lVar30] = auVar33._0_4_;
    auVar32 = vfnmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ / fVar37)),auVar33,auVar33);
    this->outSecondDerivativesTmp[lVar30] = auVar32._0_4_;
  }
  if (scalingFactorsIndex == -1) {
    uVar24 = (ulong)(~((int)uVar4 >> 0x1f) & uVar4);
  }
  else {
    pfVar9 = this->outLogLikelihoodsTmp;
    pfVar11 = this->gScaleBuffers[scalingFactorsIndex];
    uVar24 = (ulong)(~((int)uVar4 >> 0x1f) & uVar4);
    for (uVar29 = 0; uVar24 != uVar29; uVar29 = uVar29 + 1) {
      pfVar9[uVar29] = pfVar11[uVar29] + pfVar9[uVar29];
    }
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  *outSumSecondDerivative = 0.0;
  uVar29 = 0;
  pdVar20 = this->gPatternWeights;
  pfVar9 = this->outLogLikelihoodsTmp;
  pfVar11 = this->outFirstDerivativesTmp;
  pfVar12 = this->outSecondDerivativesTmp;
  while (uVar24 != uVar29) {
    auVar34._0_8_ = (double)pfVar9[uVar29];
    auVar34._8_8_ = in_XMM4_Qb;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = pdVar20[uVar29];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *outSumLogLikelihood;
    auVar32 = vfmadd213sd_fma(auVar40,auVar34,auVar1);
    *outSumLogLikelihood = auVar32._0_8_;
    auVar35._0_8_ = (double)pfVar11[uVar29];
    auVar35._8_8_ = in_XMM4_Qb;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = pdVar20[uVar29];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *outSumFirstDerivative;
    auVar32 = vfmadd213sd_fma(auVar41,auVar35,auVar2);
    *outSumFirstDerivative = auVar32._0_8_;
    auVar36._0_8_ = (double)pfVar12[uVar29];
    auVar36._8_8_ = in_XMM4_Qb;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = pdVar20[uVar29];
    uVar29 = uVar29 + 1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *outSumSecondDerivative;
    auVar32 = vfmadd213sd_fma(auVar42,auVar36,auVar3);
    *outSumSecondDerivative = auVar32._0_8_;
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDeriv(const int parIndex,
                                                                         const int childIndex,
                                                                         const int probIndex,
                                                                         const int firstDerivativeIndex,
                                                                         const int secondDerivativeIndex,
                                                                         const int categoryWeightsIndex,
                                                                         const int stateFrequenciesIndex,
                                                                         const int scalingFactorsIndex,
                                                                         double* outSumLogLikelihood,
                                                                         double* outSumFirstDerivative,
                                                                         double* outSumSecondDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(secondDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    double sumOverJD2 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        REALTYPE sumOverID2 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            sumOverID2 += freqs[i] * secondDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
        outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    *outSumSecondDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];

        *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}